

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

ostream * __thiscall
pstack::Procman::Process::dumpFrameText(Process *this,ostream *os,StackFrame *frame,int frameNo)

{
  pointer *pppVar1;
  bool *__p;
  bool bVar2;
  ostream *poVar3;
  DIE *pDVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  char *__s;
  StackFrame *pSVar8;
  sptr sVar9;
  undefined1 local_2c8 [8];
  IOFlagSave _;
  PrintableFrame pframe;
  undefined1 auStack_148 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  source;
  MaybeNamedSymbol sym;
  string name;
  undefined1 local_c8 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> src;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  StackFrame *local_90;
  undefined1 local_88 [8];
  string flags;
  undefined1 local_58 [8];
  ProcessLocation location;
  
  location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = frameNo;
  IOFlagSave::IOFlagSave((IOFlagSave *)local_2c8,(ios *)(os + *(long *)(*(long *)os + -0x18)));
  PrintableFrame::PrintableFrame((PrintableFrame *)&_.field_0x108,this,frame);
  StackFrame::scopeIP((ProcessLocation *)local_58,frame,this);
  source.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_148 = (undefined1  [8])0x0;
  source.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (this->context[0x88] != (Context)0x1) {
    ProcessLocation::source_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&source.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(ProcessLocation *)local_58);
    pppVar1 = &source.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::_M_move_assign((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)auStack_148,pppVar1);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)pppVar1);
    if ((undefined1  [8])
        source.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_148) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)local_c8,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)auStack_148);
      goto LAB_00136cf9;
    }
  }
  source.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1427df;
  sym.
  super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_payload._0_8_ = 0xffffffffffffffff;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_*,_unsigned_long,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_c8,
             (pair<const_char_*,_unsigned_long> *)
             &source.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00136cf9:
  pSVar8 = (StackFrame *)
           pframe.inlined.
           super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_90 = frame;
  if (this->context[0x8c] == (Context)0x0) {
    while (pSVar8 != pframe.frame) {
      poVar3 = std::operator<<(os,"#");
      lVar7 = *(long *)poVar3;
      lVar6 = *(long *)(lVar7 + -0x18);
      *(uint *)(poVar3 + lVar6 + 0x18) = *(uint *)(poVar3 + lVar6 + 0x18) & 0xffffff4f | 0x20;
      *(undefined8 *)(poVar3 + *(long *)(lVar7 + -0x18) + 0x10) = 2;
      poVar3 = std::operator<<(poVar3,0x20);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,location.codeloc.
                                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
      poVar3 = std::operator<<(poVar3," ");
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0x12;
      poVar3 = std::operator<<(poVar3,0x20);
      std::operator<<(poVar3,"inlined");
      std::operator<<(os," in ");
      pSVar8 = (StackFrame *)&pSVar8[-1].regs.es;
      buildDIEName(os,(DIE *)pSVar8,true);
      if ((this->context[0x88] == (Context)0x0) &&
         (plVar5 = (long *)pstack::Dwarf::Unit::getLines(), *plVar5 != 0)) {
        poVar3 = std::operator<<(os," at ");
        poVar3 = std::operator<<(poVar3,(string *)local_c8);
        poVar3 = std::operator<<(poVar3,":");
        std::ostream::operator<<(poVar3,src.first.field_2._8_4_);
        lVar7 = *plVar5;
        pppVar1 = &source.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pstack::Dwarf::DIE::attribute((AttrName)pppVar1,SUB81(pSVar8,0));
        lVar6 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)pppVar1);
        lVar7 = *(long *)(lVar7 + 0x38);
        flags.field_2._8_8_ = lVar7 + lVar6 * 0x30;
        Dwarf::DIE::~DIE((DIE *)pppVar1);
        if (*(int *)(this->context + 0xa0) == 0) {
          std::__cxx11::string::string
                    ((string *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     flags.field_2._8_8_);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pppVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((ulong)*(uint *)(lVar7 + 0x20 + lVar6 * 0x30) * 0x20 +
                                    *(long *)(*plVar5 + 0x20)),"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pppVar1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         flags.field_2._8_8_);
          std::__cxx11::string::~string((string *)pppVar1);
        }
        pstack::Dwarf::DIE::attribute((AttrName)pppVar1,SUB81(pSVar8,0));
        lVar7 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)pppVar1);
        __p = &sym.
               super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_engaged;
        std::__cxx11::string::string
                  ((string *)__p,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        name.field_2._8_8_ = lVar7;
        std::pair<std::__cxx11::string,int>::operator=
                  ((pair<std::__cxx11::string,int> *)local_c8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                    *)__p);
        std::__cxx11::string::~string((string *)__p);
        Dwarf::DIE::~DIE((DIE *)&source.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(os,"\n");
        std::__cxx11::string::~string((string *)local_88);
      }
    }
  }
  poVar3 = std::operator<<(os,"#");
  pSVar8 = local_90;
  lVar7 = *(long *)poVar3;
  lVar6 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar3 + lVar6 + 0x18) = *(uint *)(poVar3 + lVar6 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar3 + *(long *)(lVar7 + -0x18) + 0x10) = 2;
  poVar3 = std::operator<<(poVar3,0x20);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,location.codeloc.
                             super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._4_4_);
  poVar3 = std::operator<<(poVar3," ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::operator<<(poVar3,"0x");
  lVar7 = *(long *)poVar3;
  lVar6 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar3 + lVar6 + 0x18) = *(uint *)(poVar3 + lVar6 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar7 + -0x18) + 0x10) = 0x10;
  poVar3 = std::operator<<(poVar3,0x30);
  StackFrame::rawIP(pSVar8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if (location.location_ == 0) {
    std::operator<<(os," no information for frame");
  }
  else {
    sym.
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._56_8_ = &name._M_string_length;
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length._0_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"",
               (allocator<char> *)
               &source.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pSVar8->isSignalTrampoline == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,"*");
    }
    ProcessLocation::symbol_abi_cxx11_
              ((MaybeNamedSymbol *)
               &source.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ProcessLocation *)local_58);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pframe,"");
    if (bVar2) {
      if (sym.
          super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_payload._48_1_ == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sym.
                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_engaged,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sym.
                           super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_payload._M_value.first + 0x10));
        pDVar4 = ProcessLocation::die((ProcessLocation *)local_58);
        __s = "%";
        if ((pDVar4->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          __s = "!";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,__s
                  );
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sym.
                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_engaged,"<unknown>");
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sym.
                  super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_engaged,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe);
    }
    poVar3 = std::operator<<(os," in ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &sym.
                                     super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_engaged);
    poVar3 = std::operator<<(poVar3,(string *)local_88);
    poVar3 = std::operator<<(poVar3,"(");
    pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    Procman::operator<<(poVar3,(ArgPrint *)
                               &pframe.inlined.
                                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3,")");
    if (pframe.dieName.field_2._8_8_ != -1) {
      poVar3 = std::operator<<(os,"+");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    poVar3 = std::operator<<(os," in ");
    sVar9 = ProcessLocation::elf((ProcessLocation *)&src.second);
    stringify<pstack::Reader_const&>
              ((string *)
               &pframe.inlined.
                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,*(pstack **)(src._32_8_ + 0x40),
               (Reader *)
               sVar9.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi._M_pi);
    std::operator<<(poVar3,(string *)
                           &pframe.inlined.
                            super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &pframe.inlined.
                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    if (*(int *)(this->context + 0xa0) != 0) {
      poVar3 = std::operator<<(os,"@0x");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      StackFrame::rawIP(pSVar8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"");
    if (!bVar2) {
      poVar3 = std::operator<<(os," at ");
      poVar3 = std::operator<<(poVar3,(string *)local_c8);
      poVar3 = std::operator<<(poVar3,":");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::operator<<(poVar3,src.first.field_2._8_4_);
    }
    std::
    _Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_reset((_Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&source.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string
              ((string *)
               &sym.
                super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_engaged);
  }
  if (*(int *)(this->context + 0xa0) != 0) {
    poVar3 = std::operator<<(os," via ");
    Procman::operator<<(poVar3,pSVar8->mechanism);
  }
  std::operator<<(os,"\n");
  std::__cxx11::string::~string((string *)local_c8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)auStack_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&location.codeloc);
  PrintableFrame::~PrintableFrame((PrintableFrame *)&_.field_0x108);
  IOFlagSave::~IOFlagSave((IOFlagSave *)local_2c8);
  return os;
}

Assistant:

std::ostream &
Process::dumpFrameText(std::ostream &os, const StackFrame &frame, int frameNo)
{
    IOFlagSave _(os);
    PrintableFrame pframe(*this, frame);

    ProcessLocation location = frame.scopeIP(*this);
    std::vector<std::pair<std::string, int>> source;

    if (!context.options.nosrc)
        source = location.source();

    std::pair<std::string, int> src = source.size()
        ? source[0]
        : std::make_pair( "", std::numeric_limits<Elf::Addr>::max());

    if (!context.options.nodienames) {
        // inlining comes from DIEs with DW_TAG_inlined_subroutine - so no
        // point in trying this without DIE names
        for (auto i = pframe.inlined.rbegin(); i != pframe.inlined.rend(); ++i) {
           os << "#"
               << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
               << std::setw(ELF_BITS/4 + 2) << std::setfill(' ')
               << "inlined";
           os << " in ";
           buildDIEName(os, *i);
           if (!context.options.nosrc) {
               const auto &lineinfo = i->getUnit()->getLines();
               if (lineinfo) {
                  os << " at " << src.first << ":" << src.second;
                  auto &fileEnt = lineinfo->files[intmax_t(i->attribute(Dwarf::DW_AT_call_file))];
                  auto &dirname = lineinfo->directories[fileEnt.dirindex];
                  const auto &name = context.verbose ? dirname + "/" + fileEnt.name : fileEnt.name;
                  src = std::make_pair( name, intmax_t(i->attribute(Dwarf::DW_AT_call_line)));
                  os << "\n";
               }
           }
        }
    }

    os << "#"
        << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
        << std::right << "0x" << std::hex << std::setw(ELF_BITS/4) << std::setfill('0')
        << frame.rawIP() << std::dec;

    if (location.inObject()) {
        std::string name;
        std::string flags = "";
        if (frame.isSignalTrampoline)
            flags += "*";

        auto sym = location.symbol();
        if (pframe.dieName != "") {
            name = pframe.dieName;
        } else if (sym) {
            name = sym->second;
            flags += location.die() ? "%" : "!";
        } else {
            name = "<unknown>";
        }
        os << " in "
            << name
            << flags
            << "(" << ArgPrint(*this, frame) << ")";

        if (pframe.functionOffset != std::numeric_limits<Elf::Addr>::max())
            os << "+" << pframe.functionOffset;
        os << " in " << stringify(*location.elf()->io);
        if (context.verbose)
           os << "@0x" << std::hex << frame.rawIP() - location.elfReloc() << std::dec;
        if (src.first != "")
           os << " at " << src.first << ":" << std::dec << src.second;
    } else {
        os << " no information for frame";
    }
    if (context.verbose)
       os << " via " << frame.mechanism;
    os << "\n";
    return os;
}